

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg
          (nordic_itch_handler *this,itch_order_book_directory *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  const_iterator cVar4;
  iterator iVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  __hashtable *__h;
  string sym;
  uint64_t order_book_id;
  order_book ob;
  key_type local_230;
  unsigned_long local_210;
  string local_208;
  pair<const_unsigned_long,_helix::order_book> local_1e8;
  order_book local_100;
  
  lVar7 = 1;
  do {
    if (m->OrderBook[lVar7 + -1] != ' ') {
      pcVar8 = m->OrderBook + lVar7 + -1;
      break;
    }
    lVar7 = lVar7 + 1;
    pcVar8 = m->Symbol;
  } while (lVar7 != 7);
  local_210 = 0;
  for (; pcVar8 != m->Symbol; pcVar8 = pcVar8 + 1) {
    local_210 = ((long)*pcVar8 + local_210 * 10) - 0x30;
  }
  paVar1 = &local_230.field_2;
  local_230._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,m->Symbol,m->ISIN);
  lVar7 = std::__cxx11::string::find_first_of((char *)&local_230,0x11c0a1,0);
  if (lVar7 != -1) {
    std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_230);
    std::__cxx11::string::operator=((string *)&local_230,(string *)&local_1e8);
    if ((size_type *)local_1e8.first != &local_1e8.second._symbol._M_string_length) {
      operator_delete((void *)local_1e8.first,local_1e8.second._symbol._M_string_length + 1);
    }
  }
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->_symbols)._M_t,&local_230);
  if ((_Rb_tree_header *)cVar4._M_node != &(this->_symbols)._M_t._M_impl.super__Rb_tree_header) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_230._M_dataplus._M_p,
               local_230._M_dataplus._M_p + local_230._M_string_length);
    uVar2 = this->time_sec;
    uVar3 = this->time_msec;
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->_symbol_max_orders)._M_h,&local_230);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar6 = std::__throw_out_of_range("_Map_base::at");
      std::pair<const_unsigned_long,_helix::order_book>::~pair(&local_1e8);
      order_book::~order_book(&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar6);
    }
    order_book::order_book
              (&local_100,&local_208,uVar2 * 1000 + uVar3,
               *(size_t *)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                       ._M_cur + 0x28));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::pair<const_unsigned_long,_helix::order_book>::
    pair<unsigned_long_&,_helix::order_book,_true>(&local_1e8,&local_210,&local_100);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book>,std::allocator<std::pair<unsigned_long_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,helix::order_book>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book>,std::allocator<std::pair<unsigned_long_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->order_book_id_map,&local_1e8);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_1e8.second._asks._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_1e8.second._bids._M_t);
    boost::multi_index::
    multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
    ::~multi_index_container(&local_1e8.second._orders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.second._symbol._M_dataplus._M_p != &local_1e8.second._symbol.field_2) {
      operator_delete(local_1e8.second._symbol._M_dataplus._M_p,
                      local_1e8.second._symbol.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_100._asks._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_100._bids._M_t);
    boost::multi_index::
    multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
    ::~multi_index_container(&local_100._orders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._symbol._M_dataplus._M_p != &local_100._symbol.field_2) {
      operator_delete(local_100._symbol._M_dataplus._M_p,
                      local_100._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_book_directory* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));

    std::string sym{m->Symbol, ITCH_SYMBOL_LEN};
    std::size_t end = sym.find_first_of(" ");
    if (end != std::string::npos) {
        sym = sym.substr(0, end);
    }
    if (_symbols.count(sym) > 0) {
        order_book ob{sym, timestamp(), _symbol_max_orders.at(sym)};
        order_book_id_map.insert({order_book_id, std::move(ob)});
    }
}